

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::dump_path_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Path *path)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream aoStack_190 [376];
  Path *local_18;
  Path *path_local;
  
  local_18 = (Path *)this;
  path_local = (Path *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  poVar2 = ::std::operator<<(aoStack_190,"Path: Prim part = ");
  psVar3 = Path::prim_part_abi_cxx11_(local_18);
  ::std::operator<<(poVar2,(string *)psVar3);
  poVar2 = ::std::operator<<(aoStack_190,", Prop part = ");
  psVar3 = Path::prop_part_abi_cxx11_(local_18);
  ::std::operator<<(poVar2,(string *)psVar3);
  poVar2 = ::std::operator<<(aoStack_190,", Variant part = ");
  psVar3 = Path::variant_part_abi_cxx11_(local_18);
  ::std::operator<<(poVar2,(string *)psVar3);
  poVar2 = ::std::operator<<(aoStack_190,", elementName = ");
  psVar3 = Path::element_name_abi_cxx11_(local_18);
  ::std::operator<<(poVar2,(string *)psVar3);
  poVar2 = ::std::operator<<(aoStack_190,", isValid = ");
  bVar1 = Path::is_valid(local_18);
  ::std::ostream::operator<<(poVar2,bVar1);
  poVar2 = ::std::operator<<(aoStack_190,", isAbsolute = ");
  bVar1 = Path::is_absolute_path(local_18);
  ::std::ostream::operator<<(poVar2,bVar1);
  poVar2 = ::std::operator<<(aoStack_190,", isRelative = ");
  bVar1 = Path::is_relative_path(local_18);
  ::std::ostream::operator<<(poVar2,bVar1);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string dump_path(const Path &path) {
  std::stringstream ss;
  ss << "Path: Prim part = " << path.prim_part();
  ss << ", Prop part = " << path.prop_part();
  ss << ", Variant part = " << path.variant_part();
  ss << ", elementName = " << path.element_name();
  ss << ", isValid = " << path.is_valid();
  ss << ", isAbsolute = " << path.is_absolute_path();
  ss << ", isRelative = " << path.is_relative_path();

  return ss.str();
}